

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurveSpanIntersection.h
# Opt level: O3

vector<double,_std::allocator<double>_> *
anurbs::CurveSpanIntersection::compute
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,CurveBase<2L> *curve,
          VectorXd *knots_u,VectorXd *knots_v,double tolerance,bool include_curve_knots)

{
  iterator iVar1;
  long lVar2;
  long lVar3;
  Interval *span;
  void *pvVar4;
  ParameterPoint a;
  double t0;
  array<anurbs::CurveSpanIntersection::Axis,_2UL> axes;
  undefined1 local_108 [16];
  double local_f8;
  double dStack_f0;
  double local_e0;
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  local_d8;
  ParameterPoint local_a8;
  Axis local_80;
  pointer local_50;
  pointer pdStack_48;
  pointer local_40;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  CurveTessellation<2L>::compute
            (&local_d8,(CurveTessellation<2L> *)curve,(CurveBaseD *)knots_u,tolerance);
  local_80.m_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.m_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.m_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50 = (pointer)0x0;
  pdStack_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  Axis::initialize(&local_80,0,knots_u,tolerance);
  Axis::initialize((Axis *)&stack0xffffffffffffffa8,1,knots_v,tolerance);
  if (include_curve_knots) {
    local_a8.first =
         *local_d8.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
    iVar1._M_current =
         (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar1,
                 &local_a8.first);
    }
    else {
      *iVar1._M_current = local_a8.first;
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    (*curve->_vptr_CurveBase[4])(local_108,curve);
    if (local_108._0_8_ != local_108._8_8_) {
      pvVar4 = (void *)local_108._0_8_;
      do {
        local_e0 = *(double *)((long)pvVar4 + 8);
        iVar1._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (__return_storage_ptr__,iVar1,&local_e0);
        }
        else {
          *iVar1._M_current = local_e0;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        pvVar4 = (void *)((long)pvVar4 + 0x10);
      } while (pvVar4 != (void *)local_108._8_8_);
    }
    if ((void *)local_108._0_8_ != (void *)0x0) {
      operator_delete((void *)local_108._0_8_,(long)local_f8 - local_108._0_8_);
    }
  }
  if (0x10 < (long)local_d8.second.
                   super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_d8.second.
                   super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) {
    lVar2 = 1;
    do {
      local_108._0_8_ =
           local_d8.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar2 + -1];
      local_f8 = local_d8.second.
                 super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar2 + -1].
                 super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
                 [0];
      dStack_f0 = local_d8.second.
                  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar2 + -1].
                  super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
                  array[1];
      local_a8.first =
           local_d8.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar2];
      local_a8.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
      array[0] = local_d8.second.
                 super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar2].
                 super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
                 [0];
      local_a8.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
      array[1] = local_d8.second.
                 super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar2].
                 super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
                 [1];
      lVar3 = 0;
      do {
        Axis::intersect((Axis *)((long)&local_80.m_index + lVar3),curve,(ParameterPoint *)local_108,
                        &local_a8,__return_storage_ptr__);
        lVar3 = lVar3 + 0x28;
      } while (lVar3 != 0x50);
      lVar2 = lVar2 + 1;
    } while (lVar2 < (long)local_d8.second.
                           super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_d8.second.
                           super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4);
  }
  local_108._0_8_ = 1e-07;
  unique_sorted<std::vector<double,std::allocator<double>>>
            (__return_storage_ptr__,(double *)local_108);
  lVar2 = 0x50;
  do {
    pvVar4 = *(void **)((long)local_a8.second.
                              super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage
                              .m_data.array + lVar2 + -8);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,*(long *)((long)local_a8.second.
                                             super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                                             .m_storage.m_data.array + lVar2 + 8) - (long)pvVar4);
    }
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != 0);
  if (local_d8.second.
      super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.second.
                    super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.second.
                          super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.second.
                          super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (double *)0x0) {
    operator_delete(local_d8.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.first.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.first.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<double> compute(
        const CurveBase<2>& curve,
        const Eigen::VectorXd& knots_u,
        const Eigen::VectorXd& knots_v,
        const double tolerance,
        const bool include_curve_knots)
    {
        std::vector<double> intersection_parameters;

        // approximate curve with a polyline

        const auto [ts, points] = CurveTessellation<2>::compute(curve, tolerance);

        // initialize axes

        std::array<Axis, 2> axes;

        axes[0].initialize(0, knots_u, tolerance);
        axes[1].initialize(1, knots_v, tolerance);

        // add curve knots

        if (include_curve_knots) {
            double t0 = ts[0];

            intersection_parameters.push_back(t0);

            for (const auto& span : curve.spans()) {
                intersection_parameters.push_back(span.t1());
            }
        }

        // check line segments

        for (Index i = 1; i < length(points); i++) {
            const ParameterPoint a = {ts[i - 1], points[i - 1]};
            const ParameterPoint b = {ts[i], points[i]};

            for (auto& axis : axes) {
                axis.intersect(curve, a, b, intersection_parameters);
            }
        }

        unique_sorted(intersection_parameters);

        return intersection_parameters;
    }